

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QWidget_*,_QPointer<QPropertyAnimation>_>_>::erase
          (Span<QHashPrivate::Node<QWidget_*,_QPointer<QPropertyAnimation>_>_> *this,size_t bucket)

{
  byte bVar1;
  Entry *pEVar2;
  int *piVar3;
  void *pvVar4;
  
  bVar1 = this->offsets[bucket];
  this->offsets[bucket] = 0xff;
  pEVar2 = this->entries;
  piVar3 = *(int **)(pEVar2[bVar1].storage.data + 8);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if ((*piVar3 == 0) &&
       (pvVar4 = *(void **)(pEVar2[bVar1].storage.data + 8), pvVar4 != (void *)0x0)) {
      operator_delete(pvVar4);
    }
  }
  this->entries[bVar1].storage.data[0] = this->nextFree;
  this->nextFree = bVar1;
  return;
}

Assistant:

void erase(size_t bucket) noexcept(std::is_nothrow_destructible<Node>::value)
    {
        Q_ASSERT(bucket < SpanConstants::NEntries);
        Q_ASSERT(offsets[bucket] != SpanConstants::UnusedEntry);

        unsigned char entry = offsets[bucket];
        offsets[bucket] = SpanConstants::UnusedEntry;

        entries[entry].node().~Node();
        entries[entry].nextFree() = nextFree;
        nextFree = entry;
    }